

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::Pdf417::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pEVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  BitMatrixCursor<ZXing::PointT<double>_> topCur;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_00;
  SymbolInfo info;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  BitMatrix *this_00;
  SymbolInfo *pSVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int height;
  int width;
  int top;
  int left;
  vector<int,_std::allocator<int>_> codeWords;
  DecoderResult res;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  BinaryBitmap *local_208;
  ulong local_200;
  vector<int,_std::allocator<int>_> local_1f8;
  pointer local_1e0;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  pointer pEStack_1c8;
  float local_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  BitMatrix *pBVar16;
  float fVar17;
  undefined1 local_148 [40];
  pointer local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [2];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  DetectorResult local_78;
  
  if ((undefined1  [12])((undefined1  [12])*(this->super_Reader)._opts & (undefined1  [12])0x10) !=
      (undefined1  [12])0x0) {
    this_00 = BinaryBitmap::getBitMatrix(image);
    if (((this_00 == (BitMatrix *)0x0) ||
        (bVar8 = BitMatrix::findBoundingBox
                           (this_00,(int *)&local_210,(int *)&local_214,(int *)&local_218,
                            (int *)&local_21c,9), !bVar8)) ||
       ((int)local_21c < 0x33 && (int)local_218 < 0x33)) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_20c = (local_218 + local_210) - 1;
      uVar11 = (ulong)local_214;
      local_200 = (ulong)((local_21c - 1) + local_214);
      dVar14 = (double)(int)local_210 + 0.5;
      dVar15 = (double)(int)local_214 + 0.5;
      dVar13 = 1.0;
      local_1b8 = 0.0;
      iVar12 = 4;
      local_208 = image;
      do {
        fVar17 = SUB84(dVar13,0);
        topCur.p.x = dVar14;
        topCur.img = this_00;
        topCur.p.y = dVar15;
        topCur.d.x = dVar13;
        topCur.d.y = local_1b8;
        dStack_1b0 = local_1b8;
        local_1b8 = dVar13;
        local_1a8 = dVar14;
        pBVar16 = this_00;
        dVar13 = dVar15;
        pSVar10 = DetectSymbol<ZXing::PointT<double>>
                            ((SymbolInfo *)local_148,(Pdf417 *)(ulong)local_218,topCur,local_21c,
                             (int)uVar11);
        uVar7 = local_148._24_8_;
        uVar2 = local_218;
        auVar6._4_4_ = -(uint)(2 < (int)local_148._8_4_);
        auVar6._0_4_ = -(uint)(2 < (int)local_148._8_4_);
        auVar6._8_4_ = -(uint)(0 < (int)local_148._12_4_);
        auVar6._12_4_ = -(uint)(0 < (int)local_148._12_4_);
        iVar9 = movmskpd((int)pSVar10,auVar6);
        bVar8 = (int)local_148._24_8_ != -1;
        uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar8);
        if (iVar9 == 3 && bVar8) {
          local_1e0 = (pointer)local_148._0_8_;
          iStack_1d8 = local_148._8_4_;
          iStack_1d4 = local_148._12_4_;
          iStack_1d0 = local_148._16_4_;
          iStack_1cc = local_148._20_4_;
          pEStack_1c8 = (pointer)local_148._24_8_;
          local_1c0 = (float)local_148._32_4_;
          topCur_00.p.x = (double)this_00;
          topCur_00.img = (BitMatrix *)dVar15;
          topCur_00.p.y = local_1a8;
          topCur_00.d.x = dVar15;
          topCur_00.d.y = local_1b8;
          info._8_8_ = pBVar16;
          info._0_8_ = dStack_1b0;
          info._16_8_ = dVar14;
          info._24_8_ = dVar13;
          info.rowHeight = fVar17;
          ReadCodeWords<ZXing::PointT<double>>(topCur_00,info);
          DecodeCodewords((DecoderResult *)local_148,&local_1f8,2 << ((byte)uVar7 & 0x1f));
          local_78._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = local_214;
          local_78._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = local_20c;
          local_78._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
               (PointT<int>)((ulong)local_20c | local_200 << 0x20);
          local_78._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
               (PointT<int>)(local_200 << 0x20 | (ulong)local_210);
          local_78._bits._width = 0;
          local_78._bits._height = 0;
          local_78._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Result::Result(__return_storage_ptr__,(DecoderResult *)local_148,&local_78,PDF417);
          image = local_208;
          if (local_78._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p != local_a8) {
            operator_delete(local_b8._M_p,local_a8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != local_100) {
            operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
          }
          if ((pointer)local_148._24_8_ != (pointer)0x0) {
            operator_delete((void *)local_148._24_8_,(long)local_120 - local_148._24_8_);
          }
          if ((pointer)local_148._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_148._0_8_,
                            CONCAT44(local_148._20_4_,local_148._16_4_) - local_148._0_8_);
          }
          if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          goto LAB_0017512b;
        }
        dVar14 = local_1a8 + (double)(int)(local_218 - 1) * local_1b8;
        dVar15 = dVar15 + (double)(int)(local_218 - 1) * dStack_1b0;
        dVar13 = -dStack_1b0;
        local_218 = local_21c;
        local_21c = uVar2;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
      image = local_208;
    }
LAB_0017512b:
    if ((__return_storage_ptr__->_error)._type != Checksum) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->_sai).id._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->_sai).id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (__return_storage_ptr__->_error)._msg._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->_error)._msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pEVar4 = (__return_storage_ptr__->_content).encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pEVar4 != (pointer)0x0) {
      operator_delete(pEVar4,(long)(__return_storage_ptr__->_content).encodings.
                                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar4
                     );
    }
    pvVar5 = (__return_storage_ptr__->_content).bytes.
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)(__return_storage_ptr__->_content).bytes.
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5
                     );
    }
  }
  uVar2 = *(uint *)(this->super_Reader)._opts;
  DoDecode((Barcodes *)local_148,image,false,SUB41((uVar2 & 2) >> 1,0),
           (bool)((byte)(uVar2 >> 9) & 1));
  FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
            (__return_storage_ptr__,(Barcodes *)local_148);
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
            ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Barcode
Reader::decode(const BinaryBitmap& image) const
{
	if (_opts.isPure()) {
		auto res = DecodePure(image);
		if (res.error() != Error::Checksum)
			return res;
		// This falls through and tries the non-pure code path if we have a checksum error. This approach is
		// currently the best option to deal with 'aliased' input like e.g. 03-aliased.png
	}
	
	return FirstOrDefault(DoDecode(image, false, _opts.tryRotate(), _opts.returnErrors()));
}